

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall
crnlib::symbol_codec::encode(symbol_codec *this,uint sym,adaptive_arith_data_model *model)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar1 = 1;
  uVar2 = model->m_total_syms;
  do {
    bVar3 = (sym & uVar2 >> 1) != 0;
    encode(this,(uint)bVar3,(model->m_probs).m_p + uVar1,true);
    uVar1 = (ulong)((uint)bVar3 + (int)uVar1 * 2);
    bVar3 = 3 < uVar2;
    uVar2 = uVar2 >> 1;
  } while (bVar3);
  return;
}

Assistant:

void symbol_codec::encode(uint sym, adaptive_arith_data_model& model) {
  uint node = 1;

  uint bitmask = model.m_total_syms;

  do {
    bitmask >>= 1;

    uint bit = (sym & bitmask) ? 1 : 0;
    encode(bit, model.m_probs[node]);
    node = (node << 1) + bit;

  } while (bitmask > 1);
}